

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::AbandonObjectsOwnedByThread
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,CPalThread *pthrTarget)

{
  CSynchData *this_00;
  bool fHaveSharedLock;
  ObjectDomain OVar1;
  LONG LVar2;
  CPalSynchronizationManager *pCVar3;
  POwnedObjectsListNode pobj;
  LONG *Target;
  DWORD *pdwWaitState;
  LONG lTWState;
  CSynchData *psdSynchData;
  CPalSynchronizationManager *pSynchManager;
  CThreadSynchronizationInfo *pSynchInfo;
  bool fSharedSynchLock;
  OwnedObjectsListNode *poolnItem;
  PAL_ERROR palErr;
  CPalThread *pthrTarget_local;
  CPalThread *pthrCurrent_local;
  CPalSynchronizationManager *this_local;
  
  fHaveSharedLock = false;
  pCVar3 = GetInstance();
  AcquireLocalSynchLock(pthrCurrent);
  while( true ) {
    pobj = CThreadSynchronizationInfo::RemoveFirstObjectFromOwnedList
                     (&pthrTarget->synchronizationInfo);
    if (pobj == (POwnedObjectsListNode)0x0) {
      if (pthrTarget != pthrCurrent) {
        Target = (LONG *)SHMPtrToPtr((pthrTarget->synchronizationInfo).m_shridWaitAwakened);
        LVar2 = InterlockedExchange(Target,3);
        if (((LVar2 == 1) || (LVar2 == 2)) &&
           (0 < (pthrTarget->synchronizationInfo).m_twiWaitInfo.lObjCount)) {
          UnRegisterWait(this,pthrCurrent,&(pthrTarget->synchronizationInfo).m_twiWaitInfo,
                         fHaveSharedLock);
        }
      }
      if (fHaveSharedLock != false) {
        ReleaseSharedSynchLock(pthrCurrent);
      }
      ReleaseLocalSynchLock(pthrCurrent);
      DiscardAllPendingAPCs(this,pthrCurrent,pthrTarget);
      return 0;
    }
    this_00 = pobj->pPalObjSynchData;
    if (this_00 == (CSynchData *)0x0) {
      fprintf(_stderr,"] %s %s:%d","AbandonObjectsOwnedByThread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
              ,0x299);
      fprintf(_stderr,
              "Expression: NULL != psdSynchData, Description: NULL psdSynchData pointer in ownership list node\n"
             );
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) break;
    if ((fHaveSharedLock == false) &&
       (OVar1 = CSynchData::GetObjectDomain(this_00), OVar1 == SharedObject)) {
      AcquireSharedSynchLock(pthrCurrent);
      fHaveSharedLock = true;
    }
    CSynchData::ResetOwnership(this_00);
    CSynchData::SetAbandoned(this_00,true);
    CSynchData::Signal(this_00,pthrCurrent,1,false);
    CSynchData::Release(this_00,pthrCurrent);
    CSynchCache<CorUnix::_OwnedObjectsListNode>::Add
              (&pCVar3->m_cacheOwnedObjectsListNodes,pthrCurrent,pobj);
  }
  abort();
}

Assistant:

PAL_ERROR CPalSynchronizationManager::AbandonObjectsOwnedByThread(
        CPalThread * pthrCurrent,
        CPalThread * pthrTarget)
    {
        PAL_ERROR palErr = NO_ERROR;
        OwnedObjectsListNode * poolnItem;
        bool fSharedSynchLock = false;
        CThreadSynchronizationInfo * pSynchInfo =
                    &pthrTarget->synchronizationInfo;
        CPalSynchronizationManager * pSynchManager = GetInstance();

        // Local lock
        AcquireLocalSynchLock(pthrCurrent);

        // Abandon owned objects
        while (NULL != (poolnItem = pSynchInfo->RemoveFirstObjectFromOwnedList()))
        {
            CSynchData * psdSynchData = poolnItem->pPalObjSynchData;

            _ASSERT_MSG(NULL != psdSynchData,
                        "NULL psdSynchData pointer in ownership list node\n");

            VALIDATEOBJECT(psdSynchData);

            TRACE("Abandoning object with SynchData at %p\n",
                  psdSynchData);

            if (!fSharedSynchLock &&
                (SharedObject == psdSynchData->GetObjectDomain()))
            {
                AcquireSharedSynchLock(pthrCurrent);
                fSharedSynchLock = true;
            }

            // Reset ownership data
            psdSynchData->ResetOwnership();

            // Set abandoned status; in case there is a thread to be released:
            //  - if the thread is local, ReleaseFirstWaiter will reset the
            //    abandoned status
            //  - if the thread is remote, the remote worker thread will use
            //    the value and reset it
            psdSynchData->SetAbandoned(true);

            // Signal the object and trigger thread awakening
            psdSynchData->Signal(pthrCurrent, 1, false);

            // Release reference to to SynchData
            psdSynchData->Release(pthrCurrent);

            // Return node to the cache
            pSynchManager->m_cacheOwnedObjectsListNodes.Add(pthrCurrent,
                                                            poolnItem);
        }

        if (pthrTarget != pthrCurrent)
        {
            // If the target thead is not the current one, we are being called
            // at shutdown time, right before the target thread is suspended,
            // or anyway the target thread is being terminated.
            // In this case we switch its wait state to TWS_EARLYDEATH so that,
            // if the thread is currently waiting/sleeping and it wakes up
            // before shutdown code manage to suspend it, it will be rerouted
            // to ThreadPrepareForShutdown (that will be done without holding
            // any internal lock, in a way to accomodate shutdown time thread
            // suspension).
            // At this time we also unregister the wait, so no dummy nodes are
            // left around on waiting objects.
            // The TWS_EARLYDEATH wait-state will also prevent the thread from
            // successfully registering for a possible new wait in the same
            // time window.
            LONG lTWState;
            DWORD * pdwWaitState;

            pdwWaitState = SharedIDToTypePointer(DWORD,
                pthrTarget->synchronizationInfo.m_shridWaitAwakened);

            lTWState = InterlockedExchange((LONG *)pdwWaitState,
                                           TWS_EARLYDEATH);

            if ( (((LONG)TWS_WAITING == lTWState) ||
                  ((LONG)TWS_ALERTABLE == lTWState)) &&
                 (0 < pSynchInfo->m_twiWaitInfo.lObjCount) )
            {
                // Unregister the wait
                // Note: UnRegisterWait will take care of grabbing the shared
                //       synch lock, if needed.
                UnRegisterWait(pthrCurrent,
                               &pSynchInfo->m_twiWaitInfo,
                               fSharedSynchLock);
            }
        }
        // Unlock
        if (fSharedSynchLock)
        {
            ReleaseSharedSynchLock(pthrCurrent);
            fSharedSynchLock = false;
        }
        ReleaseLocalSynchLock(pthrCurrent);

        DiscardAllPendingAPCs(pthrCurrent, pthrTarget);

        return palErr;
    }